

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void process_bb_ranges(gen_ctx_t gen_ctx,bb_t_conflict bb,MIR_insn_t start_insn,MIR_insn_t tail_insn
                      )

{
  bb_t_conflict pbVar1;
  int iVar2;
  MIR_reg_t MVar3;
  uint uVar4;
  uint uVar5;
  bitmap_t local_a8;
  MIR_reg_t live_reg;
  bitmap_t args;
  MIR_insn_t insn;
  insn_var_iterator_t insn_var_iter;
  bitmap_iterator_t bi;
  int local_48;
  int incr_p;
  int op_num;
  int scan_var;
  size_t nel;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_reg_t reg;
  MIR_reg_t var;
  MIR_insn_t tail_insn_local;
  MIR_insn_t start_insn_local;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  _reg = tail_insn;
  tail_insn_local = start_insn;
  start_insn_local = (MIR_insn_t)bb;
  bb_local = (bb_t_conflict)gen_ctx;
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"  ------BB%u end: point=%d\n",bb->index & 0xffffffff,
            (ulong)(uint)gen_ctx->lr_ctx->curr_point);
  }
  bitmap_clear(*(bitmap_t *)(bb_local[2].pre + 0x38));
  bitmap_clear(*(bitmap_t *)(bb_local[2].pre + 0x30));
  if (start_insn_local[1].ops[0].data != (void *)0x0) {
    bitmap_iterator_init
              ((bitmap_iterator_t *)&insn_var_iter.op_part_num,
               (bitmap_t)start_insn_local[1].ops[0].data);
    while (iVar2 = bitmap_iterator_next
                             ((bitmap_iterator_t *)&insn_var_iter.op_part_num,(size_t *)&op_num),
          pbVar1 = bb_local, iVar2 != 0) {
      MVar3 = scan_var_to_var((gen_ctx_t)bb_local,(int)_op_num);
      make_var_live((gen_ctx_t)pbVar1,MVar3,(int)_op_num,*(int *)(bb_local[2].pre + 0x28),0);
    }
  }
  args = (bitmap_t)_reg;
  while( true ) {
    if ((bb_local->bfs != 0) && (1 < *(int *)&(bb_local->bb_link).prev)) {
      fprintf((FILE *)bb_local->bfs,"  p%-5d",(ulong)*(uint *)(bb_local[2].pre + 0x28));
      MIR_output_insn((MIR_context_t)bb_local->index,(FILE *)bb_local->bfs,(MIR_insn_t_conflict)args
                      ,*(MIR_func_t *)(bb_local->rpost + 0x40),1);
    }
    if ((int)args[1].els_num == 0xba) {
      incr_p = var_to_scan_var((gen_ctx_t)bb_local,(MIR_reg_t)args[2].els_num);
      if (-1 < incr_p) {
        make_var_dead((gen_ctx_t)bb_local,(MIR_reg_t)args[2].els_num,incr_p,
                      *(int *)(bb_local[2].pre + 0x28),1);
        *(int *)(bb_local[2].pre + 0x28) = *(int *)(bb_local[2].pre + 0x28) + 1;
      }
    }
    else {
      bi.nbit._4_4_ = 0;
      insn_var_iterator_init((insn_var_iterator_t *)&insn,(MIR_insn_t)args);
      while (iVar2 = output_insn_var_iterator_next
                               ((gen_ctx_t)bb_local,(insn_var_iterator_t *)&insn,
                                &early_clobbered_hard_reg1,&local_48), iVar2 != 0) {
        incr_p = var_to_scan_var((gen_ctx_t)bb_local,early_clobbered_hard_reg1);
        if (-1 < incr_p) {
          uVar4 = make_var_dead((gen_ctx_t)bb_local,early_clobbered_hard_reg1,incr_p,
                                *(int *)(bb_local[2].pre + 0x28),1);
          bi.nbit._4_4_ = uVar4 | bi.nbit._4_4_;
        }
      }
      if ((*(int *)(bb_local[2].pre + 4) == 0) &&
         (iVar2 = MIR_call_code_p((MIR_insn_code_t)args[1].els_num), iVar2 != 0)) {
        if (bi.nbit._4_4_ != 0) {
          *(int *)(bb_local[2].pre + 0x28) = *(int *)(bb_local[2].pre + 0x28) + 1;
        }
        bi.nbit._4_4_ = 0;
        bitmap_iterator_init
                  ((bitmap_iterator_t *)&insn_var_iter.op_part_num,
                   (bitmap_t)bb_local[1].bb_insns.head);
        while (iVar2 = bitmap_iterator_next
                                 ((bitmap_iterator_t *)&insn_var_iter.op_part_num,(size_t *)&op_num)
              , iVar2 != 0) {
          make_var_dead((gen_ctx_t)bb_local,(MIR_reg_t)_op_num,(MIR_reg_t)_op_num,
                        *(int *)(bb_local[2].pre + 0x28),1);
          bi.nbit._4_4_ = 1;
        }
        if ((int)bb_local->pre == 0) {
          local_a8 = *(bitmap_t *)(args->els_num + 8);
        }
        else {
          local_a8 = *(bitmap_t *)(args->els_num + 0x48);
        }
        if (local_a8 != (bitmap_t)0x0) {
          bitmap_iterator_init((bitmap_iterator_t *)&insn_var_iter.op_part_num,local_a8);
          while (iVar2 = bitmap_iterator_next
                                   ((bitmap_iterator_t *)&insn_var_iter.op_part_num,
                                    (size_t *)&op_num), iVar2 != 0) {
            make_var_live((gen_ctx_t)bb_local,(MIR_reg_t)_op_num,(MIR_reg_t)_op_num,
                          *(int *)(bb_local[2].pre + 0x28),1);
          }
        }
        bitmap_iterator_init
                  ((bitmap_iterator_t *)&insn_var_iter.op_part_num,
                   *(bitmap_t *)(bb_local[2].pre + 0x30));
        while (iVar2 = bitmap_iterator_next
                                 ((bitmap_iterator_t *)&insn_var_iter.op_part_num,(size_t *)&op_num)
              , iVar2 != 0) {
          if (0x21 < _op_num) {
            bitmap_set_bit_p(*(bitmap_t *)(*(long *)&bb_local[1].call_p + 0x10),_op_num & 0xffffffff
                            );
          }
        }
      }
      if (bi.nbit._4_4_ != 0) {
        *(int *)(bb_local[2].pre + 0x28) = *(int *)(bb_local[2].pre + 0x28) + 1;
      }
      bi.nbit._4_4_ = 0;
      insn_var_iterator_init((insn_var_iterator_t *)&insn,(MIR_insn_t)args);
      while (iVar2 = input_insn_var_iterator_next
                               ((gen_ctx_t)bb_local,(insn_var_iterator_t *)&insn,
                                &early_clobbered_hard_reg1,&local_48), iVar2 != 0) {
        incr_p = var_to_scan_var((gen_ctx_t)bb_local,early_clobbered_hard_reg1);
        if (-1 < incr_p) {
          uVar4 = make_var_live((gen_ctx_t)bb_local,early_clobbered_hard_reg1,incr_p,
                                *(int *)(bb_local[2].pre + 0x28),1);
          bi.nbit._4_4_ = uVar4 | bi.nbit._4_4_;
        }
      }
      if (*(int *)(bb_local[2].pre + 4) == 0) {
        target_get_early_clobbered_hard_regs
                  ((MIR_insn_t)args,(MIR_reg_t *)((long)&nel + 4),(MIR_reg_t *)&nel);
        early_clobbered_hard_reg2 = nel._4_4_;
        if (nel._4_4_ != 0xffffffff) {
          uVar4 = make_var_live((gen_ctx_t)bb_local,nel._4_4_,nel._4_4_,
                                *(int *)(bb_local[2].pre + 0x28),1);
          uVar5 = make_var_dead((gen_ctx_t)bb_local,early_clobbered_hard_reg2,
                                early_clobbered_hard_reg2,*(int *)(bb_local[2].pre + 0x28),1);
          bi.nbit._4_4_ = uVar5 | uVar4 | bi.nbit._4_4_;
        }
        early_clobbered_hard_reg2 = (MIR_reg_t)nel;
        if ((MIR_reg_t)nel != 0xffffffff) {
          uVar4 = make_var_live((gen_ctx_t)bb_local,(MIR_reg_t)nel,(MIR_reg_t)nel,
                                *(int *)(bb_local[2].pre + 0x28),1);
          uVar5 = make_var_dead((gen_ctx_t)bb_local,early_clobbered_hard_reg2,
                                early_clobbered_hard_reg2,*(int *)(bb_local[2].pre + 0x28),1);
          bi.nbit._4_4_ = uVar5 | uVar4 | bi.nbit._4_4_;
        }
      }
      if (bi.nbit._4_4_ != 0) {
        *(int *)(bb_local[2].pre + 0x28) = *(int *)(bb_local[2].pre + 0x28) + 1;
      }
    }
    if ((MIR_insn_t)args == tail_insn_local) break;
    args = (bitmap_t)DLIST_MIR_insn_t_prev((MIR_insn_t)args);
  }
  iVar2 = bitmap_equal_p(*(const_bitmap_t *)&start_insn_local[1].field_0x18,
                         *(const_bitmap_t *)(bb_local[2].pre + 0x30));
  if (iVar2 == 0) {
    __assert_fail("bitmap_equal_p (bb->in, gen_ctx->lr_ctx->live_vars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1965,"void process_bb_ranges(gen_ctx_t, bb_t, MIR_insn_t, MIR_insn_t)");
  }
  bitmap_iterator_init
            ((bitmap_iterator_t *)&insn_var_iter.op_part_num,
             *(bitmap_t *)&start_insn_local[1].field_0x18);
  while (iVar2 = bitmap_iterator_next
                           ((bitmap_iterator_t *)&insn_var_iter.op_part_num,(size_t *)&op_num),
        pbVar1 = bb_local, iVar2 != 0) {
    MVar3 = scan_var_to_var((gen_ctx_t)bb_local,(int)_op_num);
    make_var_dead((gen_ctx_t)pbVar1,MVar3,(int)_op_num,*(int *)(bb_local[2].pre + 0x28),0);
    if ((*(int *)(bb_local[2].pre + 4) == 0) &&
       (iVar2 = bitmap_bit_p(*(const_bitmap_t *)(bb_local[2].pre + 0x38),_op_num), iVar2 == 0)) {
      add_lr_bb((gen_ctx_t)bb_local,(MIR_reg_t)_op_num,(bb_t_conflict)start_insn_local);
    }
  }
  if (*(int *)(bb_local[2].pre + 4) == 0) {
    bitmap_clear(*(bitmap_t *)&start_insn_local[1].ops[0].field_0x8);
    bitmap_clear((bitmap_t)start_insn_local[1].ops[0].u.ref);
    bitmap_iterator_init
              ((bitmap_iterator_t *)&insn_var_iter.op_part_num,*(bitmap_t *)(bb_local[2].pre + 0x38)
              );
    while (iVar2 = bitmap_iterator_next
                             ((bitmap_iterator_t *)&insn_var_iter.op_part_num,(size_t *)&op_num),
          iVar2 != 0) {
      if (0x21 < _op_num) {
        bitmap_set_bit_p((bitmap_t)start_insn_local[1].ops[0].u.ref,_op_num);
      }
    }
  }
  iVar2 = bitmap_empty_p(*(const_bitmap_t *)&start_insn_local[1].field_0x18);
  if (iVar2 == 0) {
    *(int *)(bb_local[2].pre + 0x28) = *(int *)(bb_local[2].pre + 0x28) + 1;
  }
  return;
}

Assistant:

static void process_bb_ranges (gen_ctx_t gen_ctx, bb_t bb, MIR_insn_t start_insn,
                               MIR_insn_t tail_insn) {
  MIR_reg_t var, reg, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  size_t nel;
  int scan_var, op_num, incr_p;
  bitmap_iterator_t bi;
  insn_var_iterator_t insn_var_iter;

  DEBUG (2, {
    fprintf (debug_file, "  ------BB%u end: point=%d\n", (unsigned) bb->index, curr_point);
  });
  bitmap_clear (referenced_vars);
  bitmap_clear (live_vars);
  if (bb->live_out != NULL) FOREACH_BITMAP_BIT (bi, bb->live_out, nel) {
      make_var_live (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    }
  for (MIR_insn_t insn = tail_insn;; insn = DLIST_PREV (MIR_insn_t, insn)) {
    DEBUG (2, {
      fprintf (debug_file, "  p%-5d", curr_point);
      MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
    });
    if (insn->code == MIR_PHI) {
      if ((scan_var = var_to_scan_var (gen_ctx, insn->ops[0].u.var)) >= 0) {
        make_var_dead (gen_ctx, insn->ops[0].u.var, scan_var, curr_point, TRUE);
        curr_point++;
      }
      if (insn == start_insn) break;
      continue;
    }
    incr_p = FALSE;
    FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_dead (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0 && MIR_call_code_p (insn->code)) {
      if (incr_p) curr_point++;
      incr_p = FALSE;
      FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
        make_var_dead (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        incr_p = TRUE;
      }
      bitmap_t args = (optimize_level > 0 ? ((bb_insn_t) insn->data)->call_hard_reg_args
                                          : ((insn_data_t) insn->data)->u.call_hard_reg_args);
      if (args != NULL) {
        FOREACH_BITMAP_BIT (bi, args, nel) {
          make_var_live (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        }
      }
      FOREACH_BITMAP_BIT (bi, live_vars, nel) {
        MIR_reg_t live_reg;

        if (nel <= MAX_HARD_REG) continue;
        live_reg = (MIR_reg_t) nel;
        bitmap_set_bit_p (curr_cfg->call_crossed_regs, live_reg);
      }
    }
    if (incr_p) curr_point++;
    incr_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_live (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0) {
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if ((reg = early_clobbered_hard_reg1) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
      if ((reg = early_clobbered_hard_reg2) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
    }
    if (incr_p) curr_point++;
    if (insn == start_insn) break;
  }
  gen_assert (bitmap_equal_p (bb->live_in, live_vars));
  FOREACH_BITMAP_BIT (bi, bb->live_in, nel) {
    make_var_dead (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    if (scan_vars_num == 0 && !bitmap_bit_p (referenced_vars, nel))
      add_lr_bb (gen_ctx, (MIR_reg_t) nel, bb);
  }
  if (scan_vars_num == 0) { /* setup spill info for RA */
    bitmap_clear (bb->spill_gen);
    bitmap_clear (bb->spill_kill);
    FOREACH_BITMAP_BIT (bi, referenced_vars, nel) {
      if (nel > MAX_HARD_REG) bitmap_set_bit_p (bb->spill_kill, nel);
    }
  }
  if (!bitmap_empty_p (bb->live_in)) curr_point++;
}